

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  size_t *psVar2;
  uint16_t uVar3;
  PortInfo *pPVar4;
  HashElement *pHVar5;
  _List_node_base *p_Var6;
  _Self __tmp;
  int iVar7;
  bool bVar8;
  
  pHVar5 = (this->acceptignoreinfo).table[ip % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar5;
  bVar8 = false;
  do {
    if (pHVar5 == (HashElement *)0x0) break;
    if (pHVar5->key == ip) {
      bVar8 = true;
    }
    else {
      pHVar5 = pHVar5->hashnext;
      (this->acceptignoreinfo).curhashelem = pHVar5;
    }
  } while (!bVar8);
  pHVar5 = (this->acceptignoreinfo).curhashelem;
  iVar7 = -0x57;
  if (pHVar5 != (HashElement *)0x0) {
    pPVar4 = pHVar5->element;
    if (port == 0) {
      pPVar4->all = false;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar4->portlist);
    }
    else {
      plVar1 = &pPVar4->portlist;
      p_Var6 = (_List_node_base *)plVar1;
      if (pPVar4->all == false) {
        do {
          p_Var6 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var6->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var6 == (_List_node_base *)plVar1) {
            return -0x57;
          }
        } while (*(uint16_t *)&p_Var6[1]._M_next != port);
        psVar2 = &(pPVar4->portlist).
                  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
                  _M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6,0x18);
      }
      else {
        p_Var6 = (plVar1->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 ._M_node.super__List_node_base._M_next;
        bVar8 = p_Var6 == (_List_node_base *)plVar1;
        if (bVar8) {
LAB_00123505:
          p_Var6 = (_List_node_base *)operator_new(0x18);
          *(uint16_t *)&p_Var6[1]._M_next = port;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar2 = &(pPVar4->portlist).
                    super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    _M_node._M_size;
          *psVar2 = *psVar2 + 1;
        }
        else {
          uVar3 = *(uint16_t *)&p_Var6[1]._M_next;
          while (uVar3 != port) {
            p_Var6 = p_Var6->_M_next;
            bVar8 = p_Var6 == (_List_node_base *)plVar1;
            if (bVar8) goto LAB_00123505;
            uVar3 = *(uint16_t *)&p_Var6[1]._M_next;
          }
        }
        if (!bVar8) {
          return -0x57;
        }
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int RTPUDPv4Transmitter::ProcessDeleteAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV4TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}